

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArray.h
# Opt level: O3

void __thiscall
COLLADAFW::Array<COLLADABU::Math::Matrix4>::allocMemory
          (Array<COLLADABU::Math::Matrix4> *this,size_t count,int flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Matrix4 *pMVar4;
  ulong uVar5;
  ulong uVar6;
  Matrix4 *pMVar7;
  undefined4 uVar8;
  undefined4 uVar11;
  int iVar12;
  undefined1 auVar10 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar9 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = count;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x88),8) == 0) {
    uVar5 = SUB168(auVar1 * ZEXT816(0x88),0);
  }
  pMVar4 = (Matrix4 *)operator_new__(uVar5);
  auVar3 = _DAT_00841770;
  auVar2 = _DAT_00841760;
  auVar1 = _DAT_00841750;
  if (count == 0) {
    this->mData = pMVar4;
    this->mCount = 0;
    this->mCapacity = 0;
  }
  else {
    uVar5 = count * 0x88 - 0x88;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar5;
    uVar8 = SUB164(auVar14 * ZEXT816(0xf0f0f0f0f0f0f0f1),8);
    uVar11 = (undefined4)(uVar5 / 0x110000000);
    auVar9._0_8_ = CONCAT44(uVar11,uVar8);
    auVar9._8_4_ = uVar8;
    auVar9._12_4_ = uVar11;
    auVar10._0_8_ = auVar9._0_8_ >> 7;
    auVar10._8_8_ = auVar9._8_8_ >> 7;
    uVar6 = 0;
    auVar10 = auVar10 ^ _DAT_00841770;
    pMVar7 = pMVar4;
    do {
      auVar13._8_4_ = (int)uVar6;
      auVar13._0_8_ = uVar6;
      auVar13._12_4_ = (int)(uVar6 >> 0x20);
      auVar14 = (auVar13 | auVar2) ^ auVar3;
      iVar12 = auVar10._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar12 && auVar10._0_4_ < auVar14._0_4_ ||
                  iVar12 < auVar14._4_4_) & 1)) {
        pMVar7->mState = UNKNOWN;
      }
      if ((auVar14._12_4_ != auVar10._12_4_ || auVar14._8_4_ <= auVar10._8_4_) &&
          auVar14._12_4_ <= auVar10._12_4_) {
        pMVar7[1].mState = UNKNOWN;
      }
      auVar14 = (auVar13 | auVar1) ^ auVar3;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar14._0_4_ <= auVar10._0_4_)) {
        pMVar7[2].mState = UNKNOWN;
        pMVar7[3].mState = UNKNOWN;
      }
      uVar6 = uVar6 + 4;
      pMVar7 = pMVar7 + 4;
    } while ((uVar5 / 0x88 + 4 & 0xfffffffffffffffc) != uVar6);
    this->mData = pMVar4;
    this->mCount = 0;
    this->mCapacity = count;
  }
  this->mFlags = this->mFlags | flags;
  return;
}

Assistant:

void allocMemory ( size_t count, int flags = DEFAULT_ALLOC_FLAGS )
        {
            setData ( new Type[count], 0, count );
            mFlags |= flags;
        }